

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * getDirectory_abi_cxx11_(void)

{
  int i_1;
  ulong uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  string *in_RDI;
  char abs_path [1024];
  allocator local_409;
  char local_408 [1024];
  
  uVar1 = readlink("/proc/self/exe",local_408,0x400);
  if ((uint)uVar1 < 0x400) {
    uVar3 = uVar1 & 0xffffffff;
    do {
      uVar2 = uVar3;
      if ((int)uVar2 < 0) goto LAB_00109c4e;
      uVar3 = (ulong)((int)uVar2 - 1);
    } while (local_408[uVar2] != '/');
    local_408[uVar2] = '\0';
LAB_00109c4e:
    do {
      if ((int)uVar1 < 0) goto LAB_00109c62;
      uVar3 = uVar1 & 0xffffffff;
      uVar1 = (ulong)((int)uVar1 - 1);
    } while (local_408[uVar3] != '/');
    local_408[uVar3] = '\0';
LAB_00109c62:
    pcVar4 = local_408;
  }
  else {
    pcVar4 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar4,&local_409);
  return in_RDI;
}

Assistant:

string getDirectory() {
  char abs_path[1024];
  //获取可执行程序的绝对路径
  int cnt = readlink("/proc/self/exe", abs_path, 1024);
  if (cnt < 0 || cnt >= 1024) {
    return NULL;
  }

  //最后一个'/' 后面是可执行程序名，去掉devel/lib/m100/exe，只保留前面部分路径
  for (int i = cnt; i >= 0; --i) {
    if (abs_path[i] == '/') {
      abs_path[i] = '\0';
      break;
    }
  }
  for (int i = cnt; i >= 0; --i) {
    if (abs_path[i] == '/') {
      abs_path[i] = '\0';
      break;
    }
  }
  return string(abs_path);
}